

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

int message_lookup_by_sound_name(char *name)

{
  wchar_t wVar1;
  long lVar2;
  char **ppcVar3;
  
  ppcVar3 = message_lookup_by_sound_name::sound_names;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x9c) {
      return 0;
    }
    wVar1 = my_stricmp(name,*ppcVar3);
    if (wVar1 == L'\0') break;
    lVar2 = lVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
  }
  return (int)lVar2;
}

Assistant:

int message_lookup_by_sound_name(const char *name)
{
	static const char *sound_names[] = {
		#define MSG(x, s) s,
		#include "list-message.h"
		#undef MSG
	};
	size_t i;

	/* Exclude MSG_MAX since it has NULL for the sound's name. */
	for (i = 0; i < N_ELEMENTS(sound_names) - 1; i++) {
		if (my_stricmp(name, sound_names[i]) == 0)
			return (int)i;
	}

	return MSG_GENERIC;
}